

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.hpp
# Opt level: O3

void __thiscall WalkerManager::GenNewWaler(WalkerManager *this)

{
  int iVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  shared_ptr<MWakler> walker;
  value_type local_28;
  
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
  this_00->_M_use_count = 1;
  this_00->_M_weak_count = 1;
  this_00->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00112948;
  this_00[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_00[1]._M_use_count = 0;
  this_00[1]._M_weak_count = 0;
  this_00[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_00[2]._M_use_count = 0;
  this_00[2]._M_weak_count = 0;
  this_00[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  if (__libc_single_threaded == '\0') {
    LOCK();
    this_00->_M_use_count = this_00->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this_00->_M_use_count = 2;
  }
  local_28.super___shared_ptr<MWakler,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(this_00 + 1);
  local_28.super___shared_ptr<MWakler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = this_00;
  iVar1 = rand();
  *(float *)&this_00[3]._vptr__Sp_counted_base = 14.0 - (float)(iVar1 % 1000) / 200.0;
  iVar1 = rand();
  *(float *)((long)&this_00[3]._vptr__Sp_counted_base + 4) = 14.0 - (float)(iVar1 % 1000) / 200.0;
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  iVar1 = this->nextID;
  this->nextID = iVar1 + 1;
  ((element_type *)(this_00 + 1))->idx = iVar1;
  std::vector<std::shared_ptr<MWakler>,_std::allocator<std::shared_ptr<MWakler>_>_>::push_back
            (&this->walkers,&local_28);
  if (local_28.super___shared_ptr<MWakler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.super___shared_ptr<MWakler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  return;
}

Assistant:

void GenNewWaler()
    {
        std::shared_ptr<MWakler> walker = std::make_shared<MWakler>();
        UpdateRandSpeed(walker);
        walker->idx = nextID++;

        walkers.push_back(walker);
    }